

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockResult.cxx
# Opt level: O3

cmFileLockResult cmFileLockResult::MakeSystem(void)

{
  uint *puVar1;
  
  puVar1 = (uint *)__errno_location();
  return (cmFileLockResult)(((ulong)*puVar1 << 0x20) + 1);
}

Assistant:

cmFileLockResult cmFileLockResult::MakeSystem()
{
#if defined(_WIN32)
  const Error lastError = GetLastError();
#else
  const Error lastError = errno;
#endif
  return cmFileLockResult(SYSTEM, lastError);
}